

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_synth.cpp
# Opt level: O0

VkRenderPass
synthesize_render_pass
          (StateRecorder *recorder,spvc_compiler frag,uint32_t view_count,uint8_t *active_rt_mask)

{
  spvc_bool sVar1;
  bool bVar2;
  spvc_result sVar3;
  uint uVar4;
  spvc_basetype sVar5;
  spvc_type psVar6;
  ulong uVar7;
  VkPipelineBindPoint local_5c0;
  uint local_5bc;
  uint i_7;
  uint i_6;
  VkAttachmentReference2 input_references [8];
  VkAttachmentReference2 references [8];
  undefined4 local_3b0 [2];
  VkSubpassDescription2 subpass;
  VkAttachmentDescription2 *att_1;
  uint i_5;
  VkAttachmentDescription2 *att;
  uint32_t local_338;
  uint i_4;
  VkAttachmentDescription2 attachments [8];
  VkRenderPassCreateInfo2 info;
  uint input_location_to_attachment [8];
  uint output_location_to_attachment [8];
  uint local_e0;
  uint i_3;
  uint i_2;
  uint j_1;
  VkFormat base_format_1;
  uint32_t location_1;
  spvc_type rt_type_1;
  ulong uStack_c0;
  uint rt_count_1;
  size_t i_1;
  VkFormat local_b0;
  uint j;
  VkFormat base_format;
  uint32_t location;
  spvc_type rt_type;
  ulong uStack_98;
  uint rt_count;
  size_t i;
  uint num_input_rts;
  uint num_rts;
  VkFormat input_rt_formats [8];
  VkFormat rt_formats [8];
  size_t count;
  spvc_reflected_resource *list;
  spvc_resources resources;
  uint8_t *active_rt_mask_local;
  spvc_compiler psStack_20;
  uint32_t view_count_local;
  spvc_compiler frag_local;
  StateRecorder *recorder_local;
  
  if (frag == (spvc_compiler)0x0) {
    recorder_local = (StateRecorder *)0x0;
  }
  else {
    resources = (spvc_resources)active_rt_mask;
    active_rt_mask_local._4_4_ = view_count;
    psStack_20 = frag;
    frag_local = (spvc_compiler)recorder;
    sVar3 = spvc_compiler_create_shader_resources(frag,(spvc_resources *)&list);
    if (sVar3 == SPVC_SUCCESS) {
      memset(input_rt_formats + 6,0,0x20);
      memset(&num_input_rts,0,0x20);
      i._4_4_ = 0;
      i._0_4_ = VK_PIPELINE_BIND_POINT_GRAPHICS;
      sVar3 = spvc_resources_get_resource_list_for_type
                        ((spvc_resources)list,SPVC_RESOURCE_TYPE_STAGE_OUTPUT,
                         (spvc_reflected_resource **)&count,(size_t *)(rt_formats + 6));
      if (sVar3 == SPVC_SUCCESS) {
        for (uStack_98 = 0; uStack_98 < (ulong)rt_formats._24_8_; uStack_98 = uStack_98 + 1) {
          rt_type._4_4_ = 1;
          psVar6 = spvc_compiler_get_type_handle
                             (psStack_20,*(spvc_type_id *)(count + uStack_98 * 0x18 + 8));
          uVar4 = spvc_type_get_num_array_dimensions(psVar6);
          if (uVar4 == 1) {
            sVar1 = spvc_type_array_dimension_is_literal(psVar6,0);
            if (sVar1 == '\0') {
              return (VkRenderPass)0x0;
            }
            rt_type._4_4_ = spvc_type_get_array_dimension(psVar6,0);
          }
          uVar4 = spvc_compiler_get_decoration
                            (psStack_20,*(SpvId *)(count + uStack_98 * 0x18),SpvDecorationLocation);
          if (7 < uVar4 + rt_type._4_4_) {
            fprintf(_stderr,"Fossilize ERROR: RT index %u (array size %u) is out of range.\n",
                    (ulong)uVar4,(ulong)rt_type._4_4_);
            fflush(_stderr);
            return (VkRenderPass)0x0;
          }
          local_b0 = VK_FORMAT_UNDEFINED;
          sVar5 = spvc_type_get_basetype(psVar6);
          if (sVar5 == SPVC_BASETYPE_INT16) {
LAB_0010f77e:
            local_b0 = VK_FORMAT_R8G8B8A8_SINT;
          }
          else if (sVar5 == SPVC_BASETYPE_UINT16) {
LAB_0010f78a:
            local_b0 = VK_FORMAT_R8G8B8A8_UINT;
          }
          else {
            if (sVar5 == SPVC_BASETYPE_INT32) goto LAB_0010f77e;
            if (sVar5 == SPVC_BASETYPE_UINT32) goto LAB_0010f78a;
            if (sVar5 == SPVC_BASETYPE_FP16 || sVar5 == SPVC_BASETYPE_FP32) {
              local_b0 = VK_FORMAT_R8G8B8A8_UNORM;
            }
          }
          for (i_1._4_4_ = 0; i_1._4_4_ < rt_type._4_4_; i_1._4_4_ = i_1._4_4_ + 1) {
            input_rt_formats[(ulong)(uVar4 + i_1._4_4_) + 6] = local_b0;
            *(byte *)&(resources->super_ScratchMemoryAllocation)._vptr_ScratchMemoryAllocation =
                 *(byte *)&(resources->super_ScratchMemoryAllocation)._vptr_ScratchMemoryAllocation
                 | (byte)(1 << ((char)uVar4 + (char)i_1._4_4_ & 0x1fU));
          }
        }
        sVar3 = spvc_resources_get_resource_list_for_type
                          ((spvc_resources)list,SPVC_RESOURCE_TYPE_SUBPASS_INPUT,
                           (spvc_reflected_resource **)&count,(size_t *)(rt_formats + 6));
        if (sVar3 == SPVC_SUCCESS) {
          for (uStack_c0 = 0; uStack_c0 < (ulong)rt_formats._24_8_; uStack_c0 = uStack_c0 + 1) {
            rt_type_1._4_4_ = 1;
            psVar6 = spvc_compiler_get_type_handle
                               (psStack_20,*(spvc_type_id *)(count + uStack_c0 * 0x18 + 8));
            uVar4 = spvc_type_get_num_array_dimensions(psVar6);
            if (uVar4 == 1) {
              sVar1 = spvc_type_array_dimension_is_literal(psVar6,0);
              if (sVar1 == '\0') {
                return (VkRenderPass)0x0;
              }
              rt_type_1._4_4_ = spvc_type_get_array_dimension(psVar6,0);
            }
            uVar4 = spvc_compiler_get_decoration
                              (psStack_20,*(SpvId *)(count + uStack_c0 * 0x18),
                               SpvDecorationInputAttachmentIndex);
            if (7 < uVar4 + rt_type_1._4_4_) {
              fprintf(_stderr,
                      "Fossilize ERROR: Input attachment index %u (array size %u) is out of range.\n"
                      ,(ulong)uVar4,(ulong)rt_type_1._4_4_);
              fflush(_stderr);
              return (VkRenderPass)0x0;
            }
            i_2 = 0;
            sVar5 = spvc_type_get_basetype(psVar6);
            if (sVar5 == SPVC_BASETYPE_INT16) {
LAB_0010f9a4:
              i_2 = 0x2a;
            }
            else if (sVar5 == SPVC_BASETYPE_UINT16) {
LAB_0010f9b0:
              i_2 = 0x29;
            }
            else {
              if (sVar5 == SPVC_BASETYPE_INT32) goto LAB_0010f9a4;
              if (sVar5 == SPVC_BASETYPE_UINT32) goto LAB_0010f9b0;
              if (sVar5 == SPVC_BASETYPE_FP16 || sVar5 == SPVC_BASETYPE_FP32) {
                i_2 = 0x25;
              }
            }
            for (i_3 = 0; i_3 < rt_type_1._4_4_; i_3 = i_3 + 1) {
              (&num_input_rts)[uVar4 + i_3] = i_2;
            }
          }
          for (local_e0 = 0; local_e0 < 8; local_e0 = local_e0 + 1) {
            if (input_rt_formats[(ulong)local_e0 + 6] != VK_FORMAT_UNDEFINED) {
              i._4_4_ = local_e0 + 1;
            }
          }
          for (output_location_to_attachment[7] = 0; output_location_to_attachment[7] < 8;
              output_location_to_attachment[7] = output_location_to_attachment[7] + 1) {
            if ((&num_input_rts)[output_location_to_attachment[7]] != 0) {
              i._0_4_ = output_location_to_attachment[7] + VK_PIPELINE_BIND_POINT_COMPUTE;
            }
          }
          if (i._4_4_ + (VkPipelineBindPoint)i < 9) {
            memset(input_location_to_attachment + 6,0,0x20);
            memset(&info.pCorrelatedViewMasks,0,0x20);
            memset(&attachments[7].finalLayout,0,0x50);
            attachments[7].finalLayout = 0x3b9c73cc;
            memset(&local_338,0,0x1c0);
            for (att._4_4_ = 0; att._4_4_ < i._4_4_; att._4_4_ = att._4_4_ + 1) {
              if (input_rt_formats[(ulong)att._4_4_ + 6] != VK_FORMAT_UNDEFINED) {
                uVar7 = (ulong)info.pNext._4_4_;
                (&local_338)[uVar7 * 0xe] = 0x3b9c73c8;
                *(VkFormat *)((long)&attachments[uVar7].pNext + 4) =
                     input_rt_formats[(ulong)att._4_4_ + 6];
                attachments[uVar7].flags = 1;
                attachments[uVar7].format = VK_FORMAT_R4G4_UNORM_PACK8;
                attachments[uVar7].samples = 0;
                attachments[uVar7].stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
                attachments[uVar7].stencilStoreOp = 2;
                input_location_to_attachment[(ulong)att._4_4_ + 6] = info.pNext._4_4_;
                info.pNext._4_4_ = info.pNext._4_4_ + 1;
              }
            }
            for (att_1._4_4_ = VK_PIPELINE_BIND_POINT_GRAPHICS; att_1._4_4_ < (VkPipelineBindPoint)i
                ; att_1._4_4_ = att_1._4_4_ + VK_PIPELINE_BIND_POINT_COMPUTE) {
              if ((&num_input_rts)[att_1._4_4_] != 0) {
                uVar7 = (ulong)info.pNext._4_4_;
                subpass.pPreserveAttachments = &local_338 + uVar7 * 0xe;
                *subpass.pPreserveAttachments = 0x3b9c73c8;
                *(uint *)((long)&attachments[uVar7].pNext + 4) = (&num_input_rts)[att_1._4_4_];
                attachments[uVar7].flags = 1;
                attachments[uVar7].format = VK_FORMAT_UNDEFINED;
                attachments[uVar7].samples = 0;
                attachments[uVar7].stencilLoadOp = 5;
                attachments[uVar7].stencilStoreOp = 5;
                input_location_to_attachment[(ulong)att_1._4_4_ - 2] = info.pNext._4_4_;
                info.pNext._4_4_ = info.pNext._4_4_ + 1;
              }
            }
            memset(local_3b0,0,0x58);
            local_3b0[0] = 0x3b9c73ca;
            subpass.pNext._4_4_ = 0;
            subpass.flags = (1 << ((byte)active_rt_mask_local._4_4_ & 0x1f)) - 1;
            memset(&input_references[7].aspectMask,0,0x100);
            memset(&i_7,0,0x100);
            for (local_5bc = 0; local_5bc < i._4_4_; local_5bc = local_5bc + 1) {
              input_references[(ulong)local_5bc + 7].aspectMask = 0x3b9c73c9;
              if (input_rt_formats[(ulong)local_5bc + 6] == VK_FORMAT_UNDEFINED) {
                *(undefined4 *)&references[local_5bc].pNext = 0xffffffff;
                *(undefined4 *)((long)&references[local_5bc].pNext + 4) = 0;
              }
              else {
                *(uint *)&references[local_5bc].pNext =
                     input_location_to_attachment[(ulong)local_5bc + 6];
                *(undefined4 *)((long)&references[local_5bc].pNext + 4) = 2;
              }
            }
            for (local_5c0 = VK_PIPELINE_BIND_POINT_GRAPHICS; local_5c0 < (VkPipelineBindPoint)i;
                local_5c0 = local_5c0 + VK_PIPELINE_BIND_POINT_COMPUTE) {
              (&i_7)[(ulong)local_5c0 * 8] = 0x3b9c73c9;
              if ((&num_input_rts)[local_5c0] == 0) {
                *(undefined4 *)&input_references[local_5c0].pNext = 0xffffffff;
                *(undefined4 *)((long)&input_references[local_5c0].pNext + 4) = 0;
              }
              else {
                *(uint *)&input_references[local_5c0].pNext =
                     input_location_to_attachment[(ulong)local_5c0 - 2];
                *(undefined4 *)((long)&input_references[local_5c0].pNext + 4) = 5;
              }
            }
            subpass.pInputAttachments._0_4_ = i._4_4_;
            subpass._40_8_ = &input_references[7].aspectMask;
            subpass.pipelineBindPoint = (VkPipelineBindPoint)i;
            subpass._24_8_ = &i_7;
            info.pAttachments._0_4_ = 1;
            info._32_8_ = local_3b0;
            info._16_8_ = &local_338;
            bVar2 = Fossilize::StateRecorder::record_render_pass2
                              ((StateRecorder *)frag_local,(VkRenderPass)&DAT_00000001,
                               (VkRenderPassCreateInfo2 *)&attachments[7].finalLayout,0);
            if (bVar2) {
              recorder_local = (StateRecorder *)&DAT_00000001;
            }
            else {
              recorder_local = (StateRecorder *)0x0;
            }
          }
          else {
            fprintf(_stderr,"Fossilize ERROR: Number of total attachments exceeds 8.\n");
            fflush(_stderr);
            recorder_local = (StateRecorder *)0x0;
          }
        }
        else {
          recorder_local = (StateRecorder *)0x0;
        }
      }
      else {
        recorder_local = (StateRecorder *)0x0;
      }
    }
    else {
      fprintf(_stderr,"Fossilize ERROR: Failed to reflect resources.\n");
      fflush(_stderr);
      recorder_local = (StateRecorder *)0x0;
    }
  }
  return (VkRenderPass)recorder_local;
}

Assistant:

static VkRenderPass synthesize_render_pass(StateRecorder &recorder, spvc_compiler frag,
                                           uint32_t view_count, uint8_t &active_rt_mask)
{
	if (!frag)
		return VK_NULL_HANDLE;

	spvc_resources resources;
	if (spvc_compiler_create_shader_resources(frag, &resources) != SPVC_SUCCESS)
	{
		LOGE("Failed to reflect resources.\n");
		return VK_NULL_HANDLE;
	}

	const spvc_reflected_resource *list;
	size_t count;

	VkFormat rt_formats[8] = {};
	VkFormat input_rt_formats[8] = {};
	unsigned num_rts = 0;
	unsigned num_input_rts = 0;

	if (spvc_resources_get_resource_list_for_type(resources, SPVC_RESOURCE_TYPE_STAGE_OUTPUT, &list, &count) != SPVC_SUCCESS)
		return VK_NULL_HANDLE;

	for (size_t i = 0; i < count; i++)
	{
		unsigned rt_count = 1;
		spvc_type rt_type = spvc_compiler_get_type_handle(frag, list[i].type_id);

		if (spvc_type_get_num_array_dimensions(rt_type) == 1)
		{
			if (!spvc_type_array_dimension_is_literal(rt_type, 0))
				return VK_NULL_HANDLE;
			rt_count = spvc_type_get_array_dimension(rt_type, 0);
		}

		uint32_t location = spvc_compiler_get_decoration(frag, list[i].id, SpvDecorationLocation);
		if (location + rt_count >= 8)
		{
			LOGE("RT index %u (array size %u) is out of range.\n", location, rt_count);
			return VK_NULL_HANDLE;
		}

		VkFormat base_format = VK_FORMAT_UNDEFINED;
		switch (spvc_type_get_basetype(rt_type))
		{
		case SPVC_BASETYPE_FP16:
		case SPVC_BASETYPE_FP32:
			base_format = VK_FORMAT_R8G8B8A8_UNORM;
			break;

		case SPVC_BASETYPE_INT16:
		case SPVC_BASETYPE_INT32:
			base_format = VK_FORMAT_R8G8B8A8_SINT;
			break;

		case SPVC_BASETYPE_UINT16:
		case SPVC_BASETYPE_UINT32:
			base_format = VK_FORMAT_R8G8B8A8_UINT;
			break;

		default:
			break;
		}

		for (unsigned j = 0; j < rt_count; j++)
		{
			rt_formats[location + j] = base_format;
			active_rt_mask |= 1u << (location + j);
		}
	}

	if (spvc_resources_get_resource_list_for_type(resources, SPVC_RESOURCE_TYPE_SUBPASS_INPUT, &list, &count) != SPVC_SUCCESS)
		return VK_NULL_HANDLE;

	for (size_t i = 0; i < count; i++)
	{
		unsigned rt_count = 1;
		spvc_type rt_type = spvc_compiler_get_type_handle(frag, list[i].type_id);

		if (spvc_type_get_num_array_dimensions(rt_type) == 1)
		{
			if (!spvc_type_array_dimension_is_literal(rt_type, 0))
				return VK_NULL_HANDLE;
			rt_count = spvc_type_get_array_dimension(rt_type, 0);
		}

		uint32_t location = spvc_compiler_get_decoration(frag, list[i].id, SpvDecorationInputAttachmentIndex);
		if (location + rt_count >= 8)
		{
			LOGE("Input attachment index %u (array size %u) is out of range.\n", location, rt_count);
			return VK_NULL_HANDLE;
		}

		VkFormat base_format = VK_FORMAT_UNDEFINED;
		switch (spvc_type_get_basetype(rt_type))
		{
		case SPVC_BASETYPE_FP16:
		case SPVC_BASETYPE_FP32:
			base_format = VK_FORMAT_R8G8B8A8_UNORM;
			break;

		case SPVC_BASETYPE_INT16:
		case SPVC_BASETYPE_INT32:
			base_format = VK_FORMAT_R8G8B8A8_SINT;
			break;

		case SPVC_BASETYPE_UINT16:
		case SPVC_BASETYPE_UINT32:
			base_format = VK_FORMAT_R8G8B8A8_UINT;
			break;

		default:
			break;
		}

		for (unsigned j = 0; j < rt_count; j++)
			input_rt_formats[location + j] = base_format;
	}

	for (unsigned i = 0; i < 8; i++)
		if (rt_formats[i] != VK_FORMAT_UNDEFINED)
			num_rts = i + 1;

	for (unsigned i = 0; i < 8; i++)
		if (input_rt_formats[i] != VK_FORMAT_UNDEFINED)
			num_input_rts = i + 1;

	if (num_rts + num_input_rts > 8)
	{
		LOGE("Number of total attachments exceeds 8.\n");
		return VK_NULL_HANDLE;
	}

	unsigned output_location_to_attachment[8] = {};
	unsigned input_location_to_attachment[8] = {};

	VkRenderPassCreateInfo2 info = { VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2 };
	VkAttachmentDescription2 attachments[8] = {};

	for (unsigned i = 0; i < num_rts; i++)
	{
		if (rt_formats[i] != VK_FORMAT_UNDEFINED)
		{
			auto &att = attachments[info.attachmentCount];
			att.sType = VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
			att.format = rt_formats[i];
			att.samples = VK_SAMPLE_COUNT_1_BIT;
			att.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
			att.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
			att.initialLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
			att.finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
			output_location_to_attachment[i] = info.attachmentCount;
			info.attachmentCount++;
		}
	}

	for (unsigned i = 0; i < num_input_rts; i++)
	{
		if (input_rt_formats[i] != VK_FORMAT_UNDEFINED)
		{
			auto &att = attachments[info.attachmentCount];
			att.sType = VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
			att.format = input_rt_formats[i];
			att.samples = VK_SAMPLE_COUNT_1_BIT;
			att.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
			att.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
			att.initialLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
			att.finalLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
			input_location_to_attachment[i] = info.attachmentCount;
			info.attachmentCount++;
		}
	}

	VkSubpassDescription2 subpass = { VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_2 };
	subpass.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
	// view_count of 0 translates to default 0 mask.
	subpass.viewMask = (1u << view_count) - 1u;

	VkAttachmentReference2 references[8] = {};
	VkAttachmentReference2 input_references[8] = {};

	for (unsigned i = 0; i < num_rts; i++)
	{
		references[i].sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
		if (rt_formats[i] != VK_FORMAT_UNDEFINED)
		{
			references[i].attachment = output_location_to_attachment[i];
			references[i].layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
		}
		else
		{
			references[i].attachment = VK_ATTACHMENT_UNUSED;
			references[i].layout = VK_IMAGE_LAYOUT_UNDEFINED;
		}
	}

	for (unsigned i = 0; i < num_input_rts; i++)
	{
		input_references[i].sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
		if (input_rt_formats[i] != VK_FORMAT_UNDEFINED)
		{
			input_references[i].attachment = input_location_to_attachment[i];
			input_references[i].layout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
		}
		else
		{
			input_references[i].attachment = VK_ATTACHMENT_UNUSED;
			input_references[i].layout = VK_IMAGE_LAYOUT_UNDEFINED;
		}
	}

	subpass.colorAttachmentCount = num_rts;
	subpass.pColorAttachments = references;
	subpass.inputAttachmentCount = num_input_rts;
	subpass.pInputAttachments = input_references;

	info.subpassCount = 1;
	info.pSubpasses = &subpass;
	info.pAttachments = attachments;

	if (!recorder.record_render_pass2((VkRenderPass)uint64_t(1), info))
		return VK_NULL_HANDLE;

	return (VkRenderPass)uint64_t(1);
}